

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O2

upb_MiniTable * upb_MiniTable_GetSubMessageTable(upb_MiniTable *m,upb_MiniTableField *f)

{
  upb_CType uVar1;
  upb_MiniTable *puVar2;
  upb_MiniTable *puVar3;
  
  uVar1 = upb_MiniTableField_CType(f);
  if (uVar1 != kUpb_CType_Message) {
    __assert_fail("upb_MiniTableField_CType(f) == kUpb_CType_Message",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mini_table/internal/message.h"
                  ,0x82,
                  "const struct upb_MiniTable *upb_MiniTable_GetSubMessageTable(const struct upb_MiniTable *, const struct upb_MiniTableField *)"
                 );
  }
  puVar2 = upb_MiniTable_SubMessage(m,f);
  if (puVar2 != (upb_MiniTable *)0x0) {
    puVar3 = (upb_MiniTable *)0x0;
    if (puVar2 != &_kUpb_MiniTable_Empty_dont_copy_me__upb_internal_use_only) {
      puVar3 = puVar2;
    }
    return puVar3;
  }
  __assert_fail("ret",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mini_table/internal/message.h"
                ,0x84,
                "const struct upb_MiniTable *upb_MiniTable_GetSubMessageTable(const struct upb_MiniTable *, const struct upb_MiniTableField *)"
               );
}

Assistant:

UPB_API_INLINE const struct upb_MiniTable* upb_MiniTable_GetSubMessageTable(
    const struct upb_MiniTable* m, const struct upb_MiniTableField* f) {
  UPB_ASSUME(upb_MiniTableField_CType(f) == kUpb_CType_Message);
  const struct upb_MiniTable* ret = upb_MiniTable_SubMessage(m, f);
  UPB_ASSUME(ret);
  return UPB_PRIVATE(_upb_MiniTable_IsEmpty)(ret) ? NULL : ret;
}